

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

Var Js::JavascriptFunction::CallSpreadFunction
              (RecyclableObject *function,Arguments *args,AuxArray<unsigned_int> *spreadIndices)

{
  ScriptContext *scriptContext;
  undefined8 uVar1;
  long lVar2;
  size_t __n;
  uint count;
  uint uVar3;
  JavascriptMethod entryPoint;
  Var pvVar4;
  Type scriptContext_00;
  void **__s;
  ulong uVar5;
  void *apvStack_c0 [2];
  Var stackArgs [8];
  Arguments local_68;
  Arguments local_58;
  Arguments local_48;
  size_t local_38;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  stackArgs[7] = *(Var *)&args->Info;
  apvStack_c0[0] = (void *)0xa89007;
  count = GetSpreadSize((Arguments *)(stackArgs + 7),spreadIndices,scriptContext);
  apvStack_c0[0] = (void *)0xa89016;
  uVar3 = CallInfo::GetLargeArgCountWithExtraArgs((uint)(byte)(args->Info).field_0x3,count);
  scriptContext_00 = args->Info;
  local_48.Info._0_4_ = count & 0xffffff | scriptContext_00._0_4_ & 0xff000000;
  local_48.Info._4_4_ = 0;
  if (uVar3 < 9) {
    __s = apvStack_c0 + 1;
    stackArgs[5] = (Var)0x0;
    stackArgs[6] = (Var)0x0;
    stackArgs[3] = (Var)0x0;
    stackArgs[4] = (Var)0x0;
    stackArgs[1] = (Var)0x0;
    stackArgs[2] = (Var)0x0;
    apvStack_c0[1] = (void *)0x0;
    stackArgs[0] = (Var)0x0;
  }
  else {
    uVar5 = (ulong)uVar3;
    local_38 = uVar5 * 8;
    apvStack_c0[0] = (void *)0xa8905d;
    ThreadContext::ProbeStack
              (scriptContext->threadContext,uVar5 * 8 + 0xc00,scriptContext,(PVOID)0x0);
    __n = local_38;
    lVar2 = -(uVar5 * 8 + 0xf & 0xfffffffffffffff0);
    __s = (void **)((long)stackArgs + lVar2 + -8);
    *(undefined8 *)((long)apvStack_c0 + lVar2) = 0xa89080;
    memset(__s,0,__n);
    scriptContext_00 = args->Info;
  }
  local_68.Values = args->Values;
  local_68.Info = scriptContext_00;
  local_48.Values = __s;
  __s[-1] = (void *)0xa890c8;
  SpreadArgs(&local_68,&local_48,spreadIndices,(ScriptContext *)scriptContext_00);
  __s[-1] = (void *)0xa890d0;
  entryPoint = RecyclableObject::GetEntryPoint(function);
  local_58.Info = local_48.Info;
  local_58.Values = local_48.Values;
  __s[-1] = (void *)0x1;
  uVar1 = __s[-1];
  __s[-1] = (void *)0xa890ea;
  pvVar4 = CallFunction<true>(function,entryPoint,&local_58,SUB81(uVar1,0));
  return pvVar4;
}

Assistant:

Var JavascriptFunction::CallSpreadFunction(RecyclableObject* function, Arguments args, const Js::AuxArray<uint32> *spreadIndices)
    {
        ScriptContext* scriptContext = function->GetScriptContext();

        // Work out the expanded number of arguments.
        uint spreadSize = GetSpreadSize(args, spreadIndices, scriptContext);
        uint32 actualLength = CallInfo::GetLargeArgCountWithExtraArgs(args.Info.Flags, spreadSize);

        // Allocate (if needed) space for the expanded arguments.
        Arguments outArgs(CallInfo(args.Info.Flags, spreadSize), nullptr);
        Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
        size_t outArgsSize = 0;
        if (actualLength > STACK_ARGS_ALLOCA_THRESHOLD)
        {
            PROBE_STACK(scriptContext, actualLength * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
            outArgsSize = actualLength * sizeof(Var);
            outArgs.Values = (Var*)_alloca(outArgsSize);
            ZeroMemory(outArgs.Values, outArgsSize);
        }
        else
        {
            outArgs.Values = stackArgs;
            outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
            ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
        }

        SpreadArgs(args, outArgs, spreadIndices, scriptContext);

        // Number of arguments are allowed to be more than Constants::MaxAllowedArgs in runtime. Need to use the large argcount logic in this case.
        return JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), outArgs, true);
    }